

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c74_mock_misc.h
# Opt level: O0

void object_warn(void *param_1,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_8f8 [16];
  undefined8 local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  undefined8 local_898;
  undefined8 local_888;
  undefined8 local_878;
  undefined8 local_868;
  undefined8 local_858;
  undefined4 local_848;
  undefined4 local_844;
  va_list ap;
  char local_828 [8];
  char msg [2050];
  char *fmt_local;
  void *param_0_local;
  
  if (in_AL != '\0') {
    local_8c8 = in_XMM0_Qa;
    local_8b8 = in_XMM1_Qa;
    local_8a8 = in_XMM2_Qa;
    local_898 = in_XMM3_Qa;
    local_888 = in_XMM4_Qa;
    local_878 = in_XMM5_Qa;
    local_868 = in_XMM6_Qa;
    local_858 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_8f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_844 = 0x30;
  local_848 = 0x10;
  local_8e8 = in_RDX;
  local_8e0 = in_RCX;
  local_8d8 = in_R8;
  local_8d0 = in_R9;
  vsnprintf(local_828,0x800,fmt,&local_848);
  msg[0x7f8] = '\0';
  std::operator<<((ostream *)&std::cout,local_828);
  return;
}

Assistant:

MOCK_EXPORT void object_warn(void*, const char* fmt, ...) {
        char msg[2048 + 2];
        va_list ap;

        va_start(ap, fmt);
        vsnprintf(msg, 2048, fmt, ap);
        va_end(ap);
        msg[2048] = '\0';
        //printf(msg);
        std::cout << msg;
    }